

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

bool __thiscall DataFilters::StringFilter::isFiltered(StringFilter *this,string *token)

{
  bool bVar1;
  pointer pcVar2;
  size_type sVar3;
  undefined1 *puVar4;
  int iVar5;
  long lVar6;
  size_type sVar7;
  bool bVar8;
  string input;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  std::__cxx11::string::_M_assign((string *)&local_50,(string *)token);
  puVar4 = local_50;
  if (this->_isSensitive == false) {
    pcVar2 = (token->_M_dataplus)._M_p;
    sVar3 = token->_M_string_length;
    for (sVar7 = 0; sVar3 != sVar7; sVar7 = sVar7 + 1) {
      iVar5 = toupper((int)pcVar2[sVar7]);
      puVar4[sVar7] = (char)iVar5;
    }
  }
  if (this->_isExact == true) {
    iVar5 = std::__cxx11::string::compare((string *)&local_50,(string *)this);
    bVar8 = iVar5 == 0;
  }
  else {
    lVar6 = std::__cxx11::string::find((string *)&local_50,(string *)this,0);
    bVar8 = lVar6 != -1;
  }
  bVar1 = this->_isAccept;
  std::__cxx11::string::~string((string *)&local_50);
  return (bool)(bVar8 ^ bVar1 ^ 1);
}

Assistant:

bool
        isFiltered(std::string const & token) const
        {

            std::string input;
            
            // Check if filtering is case sensitive
            input = token;
            if (!this->_isSensitive)
            {
                std::transform(token.begin(), token.end(), input.begin(), ::toupper);
            }
            
            // Check if filtering is exact or not
            bool isMatch = false;
            if (this->_isExact)
            {
                isMatch = input.compare(this->_pattern) == 0;
            }
            else
            {
                isMatch = input.find(this->_pattern) != std::string::npos;
            }
            
            return (this->_isAccept ? isMatch : !isMatch);
            
        }